

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *p,Gia_PtrAre_t Sta)

{
  Gia_Man_t *pGVar1;
  Vec_Vec_t *pVVar2;
  int iVar3;
  uint uVar4;
  int iLit1;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  abctime aVar8;
  Gia_StaAre_t *pSta;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  ulong uVar9;
  abctime aVar10;
  long lVar11;
  int iVar12;
  int local_38;
  
  iVar3 = p->nRecCalls + 1;
  p->nRecCalls = iVar3;
  iVar12 = 0;
  if (iVar3 != 1000000) {
    iVar12 = 0;
    while ((iVar12 < p->pNew->vCis->nSize &&
           (pGVar6 = Gia_ManCi(p->pNew,iVar12), pGVar6 != (Gia_Obj_t *)0x0))) {
      pGVar6->Value = 0;
      iVar12 = iVar12 + 1;
    }
    iVar12 = 0;
    while( true ) {
      pGVar1 = p->pAig;
      if ((pGVar1->nRegs <= iVar12) ||
         (pGVar6 = Gia_ManCo(pGVar1,(pGVar1->vCos->nSize - pGVar1->nRegs) + iVar12),
         pGVar6 == (Gia_Obj_t *)0x0)) break;
      if (1 < pGVar6->Value) {
        Gia_ManIncrementTravId(p->pNew);
        pGVar1 = p->pNew;
        iVar3 = Abc_Lit2Var(pGVar6->Value);
        pGVar6 = Gia_ManObj(pGVar1,iVar3);
        Gia_ManAreMostUsedPi_rec(pGVar1,pGVar6);
      }
      iVar12 = iVar12 + 1;
    }
    pGVar6 = (Gia_Obj_t *)0x0;
    iVar12 = 0;
    while ((iVar12 < p->pNew->vCis->nSize &&
           (pGVar7 = Gia_ManCi(p->pNew,iVar12), pGVar7 != (Gia_Obj_t *)0x0))) {
      if ((pGVar6 == (Gia_Obj_t *)0x0) || (pGVar6->Value < pGVar7->Value)) {
        pGVar6 = pGVar7;
      }
      iVar12 = iVar12 + 1;
    }
    if (pGVar6 == (Gia_Obj_t *)0x0 || pGVar6->Value < 2) {
      aVar8 = Abc_Clock();
      pSta = Gia_ManAreCreateStaNew(p);
      pSta->iPrev = Sta;
      if (p->fMiter != 0) {
        iVar12 = 0;
        while ((pGVar1 = p->pAig, iVar12 < pGVar1->vCos->nSize - pGVar1->nRegs &&
               (pGVar6 = Gia_ManCo(pGVar1,iVar12), pGVar6 != (Gia_Obj_t *)0x0))) {
          pGVar1 = p->pNew;
          iVar3 = Abc_Lit2Var(pGVar6->Value);
          pGVar7 = Gia_ManObj(pGVar1,iVar3);
          if ((~*(ulong *)pGVar7 & 0x1fffffff1fffffff) != 0) {
LAB_00591b6e:
            p->iOutFail = iVar12;
            p->fStopped = 1;
            if (p->pTarget != (Gia_StaAre_t *)0x0) {
              __assert_fail("p->pTarget == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                            ,0x617,"int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *, Gia_PtrAre_t)");
            }
            p->pTarget = pSta;
            goto LAB_00591b90;
          }
          if ((int)pGVar6->Value < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf3,"int Abc_LitIsCompl(int)");
          }
          if ((pGVar6->Value & 1) != 0) goto LAB_00591b6e;
          iVar12 = iVar12 + 1;
        }
      }
      p->fStopped = 0;
      Gia_ManAreCubeProcess(p,pSta);
      aVar10 = Abc_Clock();
      local_38 = (int)aVar8;
      p->timeCube = p->timeCube + ((int)aVar10 - local_38);
      iVar12 = p->fStopped;
    }
    else {
      pVVar2 = p->vCiTfos;
      iVar12 = Gia_ObjCioId(pGVar6);
      p_00 = Vec_VecEntryInt(pVVar2,iVar12);
      pVVar2 = p->vCiLits;
      iVar12 = Gia_ObjCioId(pGVar6);
      p_01 = Vec_VecEntryInt(pVVar2,iVar12);
      iVar12 = p_00->nSize;
      if (iVar12 != p_01->nSize) {
        __assert_fail("Vec_IntSize(vTfos) == Vec_IntSize(vLits)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                      ,0x622,"int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *, Gia_PtrAre_t)");
      }
      for (lVar11 = 0; lVar11 < iVar12; lVar11 = lVar11 + 1) {
        pGVar1 = p->pAig;
        iVar12 = Vec_IntEntry(p_00,(int)lVar11);
        pGVar6 = Gia_ManObj(pGVar1,iVar12);
        if (pGVar6 == (Gia_Obj_t *)0x0) break;
        if (p_01->nSize <= lVar11) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p_01->pArray[lVar11] = pGVar6->Value;
        uVar5 = (uint)*(ulong *)pGVar6;
        uVar9 = *(ulong *)pGVar6 & 0x1fffffff;
        if (uVar9 == 0x1fffffff || (int)uVar5 < 0) {
          if ((int)uVar5 < 0 && (int)uVar9 != 0x1fffffff) {
            uVar4 = Gia_ObjFanin0Copy(pGVar6);
          }
          else {
            uVar4 = 0;
            if ((uVar5 & 0x9fffffff) != 0x9fffffff) {
              __assert_fail("Gia_ObjIsCi(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                            ,0x62c,"int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *, Gia_PtrAre_t)");
            }
          }
        }
        else {
          pGVar1 = p->pNew;
          iVar12 = Gia_ObjFanin0Copy(pGVar6);
          iVar3 = Gia_ObjFanin1Copy(pGVar6);
          uVar4 = Gia_ManHashAnd(pGVar1,iVar12,iVar3);
        }
        pGVar6->Value = uVar4;
        iVar12 = p_00->nSize;
      }
      iVar12 = Gia_ManAreDeriveNexts_rec(p,Sta);
      if (iVar12 == 0) {
        for (iVar12 = 0; iVar12 < p_00->nSize; iVar12 = iVar12 + 1) {
          pGVar1 = p->pAig;
          iVar3 = Vec_IntEntry(p_00,iVar12);
          pGVar6 = Gia_ManObj(pGVar1,iVar3);
          if (pGVar6 == (Gia_Obj_t *)0x0) break;
          uVar5 = (uint)*(ulong *)pGVar6;
          uVar9 = *(ulong *)pGVar6 & 0x1fffffff;
          if (uVar9 == 0x1fffffff || (int)uVar5 < 0) {
            if ((int)uVar5 < 0 && (int)uVar9 != 0x1fffffff) {
              uVar4 = Gia_ObjFanin0Copy(pGVar6);
            }
            else {
              uVar4 = 1;
              if ((uVar5 & 0x9fffffff) != 0x9fffffff) {
                __assert_fail("Gia_ObjIsCi(pObj)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                              ,0x63b,"int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *, Gia_PtrAre_t)");
              }
            }
          }
          else {
            pGVar1 = p->pNew;
            iVar3 = Gia_ObjFanin0Copy(pGVar6);
            iLit1 = Gia_ObjFanin1Copy(pGVar6);
            uVar4 = Gia_ManHashAnd(pGVar1,iVar3,iLit1);
          }
          pGVar6->Value = uVar4;
        }
        iVar12 = Gia_ManAreDeriveNexts_rec(p,Sta);
        if (iVar12 == 0) {
          iVar12 = 0;
          while( true ) {
            if (p_00->nSize <= iVar12) {
              return 0;
            }
            pGVar1 = p->pAig;
            iVar3 = Vec_IntEntry(p_00,iVar12);
            pGVar6 = Gia_ManObj(pGVar1,iVar3);
            if (pGVar6 == (Gia_Obj_t *)0x0) break;
            uVar5 = Vec_IntEntry(p_01,iVar12);
            pGVar6->Value = uVar5;
            iVar12 = iVar12 + 1;
          }
          return 0;
        }
      }
LAB_00591b90:
      iVar12 = 1;
    }
  }
  return iVar12;
}

Assistant:

int Gia_ManAreDeriveNexts_rec( Gia_ManAre_t * p, Gia_PtrAre_t Sta )
{
    Gia_Obj_t * pPivot;
    Vec_Int_t * vLits, * vTfos;
    Gia_Obj_t * pObj;
    int i;
    abctime clk;
    if ( ++p->nRecCalls == MAX_CALL_NUM )
        return 0;
    if ( (pPivot = Gia_ManAreMostUsedPi(p)) == NULL )
    {
        Gia_StaAre_t * pNew;
        clk = Abc_Clock();
        pNew = Gia_ManAreCreateStaNew( p );
        pNew->iPrev = Sta;
        p->fStopped = (p->fMiter && (Gia_ManCheckPOstatus(p) & 1));
        if ( p->fStopped )
        {
            assert( p->pTarget == NULL );
            p->pTarget = pNew;
            return 1;
        }
        Gia_ManAreCubeProcess( p, pNew );
        p->timeCube += Abc_Clock() - clk;
        return p->fStopped;
    }
    // remember values in the cone and perform update
    vTfos = Vec_VecEntryInt( p->vCiTfos, Gia_ObjCioId(pPivot) );
    vLits = Vec_VecEntryInt( p->vCiLits, Gia_ObjCioId(pPivot) );
    assert( Vec_IntSize(vTfos) == Vec_IntSize(vLits) );
    Gia_ManForEachObjVec( vTfos, p->pAig, pObj, i )
    {
        Vec_IntWriteEntry( vLits, i, pObj->Value );
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( p->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        else 
        {
            assert( Gia_ObjIsCi(pObj) );
            pObj->Value = 0;
        }
    }
    if ( Gia_ManAreDeriveNexts_rec( p, Sta ) )
        return 1;
    // compute different values
    Gia_ManForEachObjVec( vTfos, p->pAig, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( p->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        else 
        {
            assert( Gia_ObjIsCi(pObj) );
            pObj->Value = 1;
        }
    }
    if ( Gia_ManAreDeriveNexts_rec( p, Sta ) )
        return 1;
    // reset the original values
    Gia_ManForEachObjVec( vTfos, p->pAig, pObj, i )
        pObj->Value = Vec_IntEntry( vLits, i );
    return 0;
}